

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhsum.c
# Opt level: O0

int XSUM_usage(char *exename)

{
  undefined8 in_RDI;
  
  XSUM_log("%s %s by %s \n",in_RDI,"0.8.0","Yann Collet");
  XSUM_log("Print or verify checksums using fast non-cryptographic algorithm xxHash \n\n");
  XSUM_log("Usage: %s [options] [files] \n\n",in_RDI);
  XSUM_log("When no filename provided or when \'-\' is provided, uses stdin as input. \n");
  XSUM_log("Options: \n");
  XSUM_log("  -H#         algorithm selection: 0,1,2 or 32,64,128 (default: %i) \n",
           (ulong)g_defaultAlgo);
  XSUM_log("  -c, --check read xxHash checksum from [files] and check them \n");
  XSUM_log("  -h, --help  display a long help page about advanced options \n");
  return 0;
}

Assistant:

static int XSUM_usage(const char* exename)
{
    XSUM_log( WELCOME_MESSAGE(exename) );
    XSUM_log( "Print or verify checksums using fast non-cryptographic algorithm xxHash \n\n" );
    XSUM_log( "Usage: %s [options] [files] \n\n", exename);
    XSUM_log( "When no filename provided or when '-' is provided, uses stdin as input. \n");
    XSUM_log( "Options: \n");
    XSUM_log( "  -H#         algorithm selection: 0,1,2 or 32,64,128 (default: %i) \n", (int)g_defaultAlgo);
    XSUM_log( "  -c, --check read xxHash checksum from [files] and check them \n");
    XSUM_log( "  -h, --help  display a long help page about advanced options \n");
    return 0;
}